

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addHashMemorySupport(TranslateToFuzzReader *this)

{
  Builder *this_00;
  Module *pMVar1;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var2;
  bool bVar3;
  Const *pCVar4;
  LocalGet *pLVar5;
  Binary *pBVar6;
  Load *right;
  undefined8 *puVar7;
  long lVar8;
  ulong extraout_RDX;
  uint uVar9;
  Address offset;
  optional<wasm::Type> type;
  initializer_list<wasm::Type> __l;
  string_view sVar10;
  Name name;
  Name NVar11;
  Name NVar12;
  Literal local_118;
  Name local_100;
  Name local_f0;
  undefined1 local_e0 [8];
  Literal zero;
  Name local_b8;
  Name local_a8;
  HeapType local_98;
  Block *local_90;
  undefined1 auStack_88 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> contents;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_68;
  char *pcStack_60;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  allocator_type local_3c [4];
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_38;
  
  bVar3 = Random::oneIn(&this->random,2);
  if (!bVar3) {
    auStack_88 = (undefined1  [8])0x0;
    contents.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    contents.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = &this->builder;
    pCVar4 = Builder::makeConst<unsigned_int>(this_00,0x1505);
    local_58._M_impl.super__Vector_impl_data._M_start =
         (pointer)Builder::makeLocalSet(this_00,0,(Expression *)pCVar4);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
               (Expression **)&local_58);
    Literal::makeFromInt32
              ((Literal *)local_e0,0,
               (Type)*(uintptr_t *)
                      ((long)(((this->wasm->memories).
                               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                      + 0x50));
    for (uVar9 = 0; offset.addr._4_4_ = 0, offset.addr._0_4_ = uVar9,
        offset.addr < (this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr; uVar9 = uVar9 + 1) {
      pLVar5 = Builder::makeLocalGet(this_00,0,(Type)0x2);
      pCVar4 = Builder::makeConst<unsigned_int>(this_00,5);
      pBVar6 = Builder::makeBinary(this_00,ShlInt32,(Expression *)pLVar5,(Expression *)pCVar4);
      pLVar5 = Builder::makeLocalGet(this_00,0,(Type)0x2);
      pBVar6 = Builder::makeBinary(this_00,AddInt32,(Expression *)pBVar6,(Expression *)pLVar5);
      ::wasm::Literal::Literal(&local_118,(Literal *)local_e0);
      pCVar4 = Builder::makeConst(this_00,&local_118);
      right = Builder::makeLoad(this_00,1,false,offset,1,(Expression *)pCVar4,(Type)0x2,
                                (Name)*(string_view *)
                                       (((this->wasm->memories).
                                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               );
      pBVar6 = Builder::makeBinary(this_00,XorInt32,(Expression *)pBVar6,(Expression *)right);
      local_58._M_impl.super__Vector_impl_data._M_start =
           (pointer)Builder::makeLocalSet(this_00,0,(Expression *)pBVar6);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
                 (Expression **)&local_58);
      ::wasm::Literal::~Literal(&local_118);
    }
    local_58._M_impl.super__Vector_impl_data._M_start =
         (pointer)Builder::makeLocalGet(this_00,0,(Type)0x2);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
               (Expression **)&local_58);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_90 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                                  )auStack_88,type);
    pMVar1 = this->wasm;
    Name::Name((Name *)&zero.type,"hashMemory");
    sVar10 = (string_view)Names::getValidFunctionName(pMVar1,(Name)stack0xffffffffffffff38);
    (this->hashMemoryName).super_IString.str = sVar10;
    pMVar1 = this->wasm;
    ::wasm::HeapType::HeapType(&local_98,(Signature)(ZEXT816(2) << 0x40));
    local_38._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
         (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)0x2;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_38;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_58,__l,local_3c);
    name.super_IString.str._M_str = (char *)sVar10._M_len;
    name.super_IString.str._M_len = (size_t)&local_68;
    Builder::makeFunction
              (name,(HeapType)sVar10._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,
               (Expression *)&local_58);
    puVar7 = (undefined8 *)::wasm::Module::addFunction((unique_ptr *)pMVar1);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_68);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_58);
    if (this->preserveImportsAndExports == false) {
      pMVar1 = this->wasm;
      Name::Name(&local_b8,"hashMemory");
      NVar11.super_IString.str._M_str = (char *)local_b8.super_IString.str._M_len;
      NVar11.super_IString.str._M_len = (size_t)pMVar1;
      lVar8 = ::wasm::Module::getExportOrNull(NVar11);
      if (lVar8 == 0) {
        pMVar1 = this->wasm;
        Name::Name(&local_100,"hashMemory");
        local_58._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar7;
        local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar7[1];
        local_58._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_68._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
             (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
             local_100.super_IString.str._M_len;
        pcStack_60 = local_100.super_IString.str._M_str;
        local_3c[0] = (allocator_type)0x0;
        local_3c[1] = (allocator_type)0x0;
        local_3c[2] = (allocator_type)0x0;
        local_3c[3] = (allocator_type)0x0;
        std::
        make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                  ((Name *)&local_38,(ExternalKind *)&local_68,
                   (variant<wasm::Name,_wasm::HeapType> *)local_3c);
        ::wasm::Module::addExport((unique_ptr *)pMVar1);
        std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                  ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_38);
        pMVar1 = this->wasm;
        Name::Name(&local_a8,"memory");
        NVar12.super_IString.str._M_str = (char *)local_a8.super_IString.str._M_len;
        NVar12.super_IString.str._M_len = (size_t)pMVar1;
        lVar8 = ::wasm::Module::getExportOrNull(NVar12);
        if (lVar8 == 0) {
          pMVar1 = this->wasm;
          Name::Name(&local_f0,"memory");
          _Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
               (((this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
          local_58._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                _Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
          local_58._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                ((long)_Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                       super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
          local_58._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_68._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
               (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
               (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
               local_f0.super_IString.str._M_len;
          pcStack_60 = local_f0.super_IString.str._M_str;
          local_3c[0] = (allocator_type)0x2;
          local_3c[1] = (allocator_type)0x0;
          local_3c[2] = (allocator_type)0x0;
          local_3c[3] = (allocator_type)0x0;
          std::
          make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                    ((Name *)&local_38,(ExternalKind *)&local_68,
                     (variant<wasm::Name,_wasm::HeapType> *)local_3c);
          ::wasm::Module::addExport((unique_ptr *)pMVar1);
          std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                    ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_38);
        }
      }
    }
    ::wasm::Literal::~Literal((Literal *)local_e0);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_88);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addHashMemorySupport() {
  // Don't always add this.
  if (oneIn(2)) {
    return;
  }

  // Add memory hasher helper (for the hash, see hash.h). The function looks
  // like:
  // function hashMemory() {
  //   hash = 5381;
  //   hash = ((hash << 5) + hash) ^ mem[0];
  //   hash = ((hash << 5) + hash) ^ mem[1];
  //   ..
  //   return hash;
  // }
  std::vector<Expression*> contents;
  contents.push_back(
    builder.makeLocalSet(0, builder.makeConst(uint32_t(5381))));
  auto zero = Literal::makeFromInt32(0, wasm.memories[0]->addressType);
  for (Index i = 0; i < fuzzParams->USABLE_MEMORY; i++) {
    contents.push_back(builder.makeLocalSet(
      0,
      builder.makeBinary(
        XorInt32,
        builder.makeBinary(
          AddInt32,
          builder.makeBinary(ShlInt32,
                             builder.makeLocalGet(0, Type::i32),
                             builder.makeConst(uint32_t(5))),
          builder.makeLocalGet(0, Type::i32)),
        builder.makeLoad(1,
                         false,
                         i,
                         1,
                         builder.makeConst(zero),
                         Type::i32,
                         wasm.memories[0]->name))));
  }
  contents.push_back(builder.makeLocalGet(0, Type::i32));
  auto* body = builder.makeBlock(contents);
  hashMemoryName = Names::getValidFunctionName(wasm, "hashMemory");
  auto* hasher = wasm.addFunction(builder.makeFunction(
    hashMemoryName, Signature(Type::none, Type::i32), {Type::i32}, body));

  if (!preserveImportsAndExports && !wasm.getExportOrNull("hashMemory")) {
    wasm.addExport(
      builder.makeExport("hashMemory", hasher->name, ExternalKind::Function));
    // Export memory so JS fuzzing can use it
    if (!wasm.getExportOrNull("memory")) {
      wasm.addExport(builder.makeExport(
        "memory", wasm.memories[0]->name, ExternalKind::Memory));
    }
  }
}